

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_converter.hpp
# Opt level: O0

longdouble *
trial::protocol::json::detail::power10<long_double>(longdouble *__return_storage_ptr__,int exponent)

{
  ulong uVar1;
  __type_conflict *p_Var2;
  int exponent_local;
  
  uVar1 = (ulong)__return_storage_ptr__ & 0xffffffff;
  if (uVar1 < 0xb) {
    p_Var2 = (__type_conflict *)
             ((long)&switchD_0011e96e::switchdataD_00127610 +
             (long)(int)(&switchD_0011e96e::switchdataD_00127610)[uVar1]);
    switch(uVar1) {
    case 0:
      break;
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
      break;
    case 7:
      break;
    case 8:
      break;
    case 9:
      break;
    case 10:
    }
  }
  else {
    p_Var2 = std::pow<long_double,int>
                       ((__type_conflict *)((ulong)__return_storage_ptr__ & 0xffffffff),
                        (longdouble)10.0,exponent);
  }
  return (longdouble *)p_Var2;
}

Assistant:

RealT power10(int exponent)
{
    switch (exponent)
    {
    case 0: return RealT(1.0);
    case 1: return RealT(1E1);
    case 2: return RealT(1E2);
    case 3: return RealT(1E3);
    case 4: return RealT(1E4);
    case 5: return RealT(1E5);
    case 6: return RealT(1E6);
    case 7: return RealT(1E7);
    case 8: return RealT(1E8);
    case 9: return RealT(1E9);
    case 10: return RealT(1E10);
    default: return std::pow(RealT(10), exponent);
    }
}